

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O3

void __thiscall DCFGReader::buildCFG(DCFGReader *this,int entry)

{
  map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  int iVar2;
  int iVar3;
  DCFGReader *pDVar4;
  undefined8 *******pppppppuVar5;
  mapped_type *pmVar6;
  CFG *this_01;
  CfgNode *pCVar7;
  CfgNode *pCVar8;
  _List_node_base *p_Var9;
  BlockData *this_02;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  CFG *pCVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  int src_id;
  list<int,_std::allocator<int>_> worklist;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int local_c4;
  CfgNode *local_c0;
  int local_b4;
  _Base_ptr local_b0;
  DCFGReader *local_a8;
  undefined8 *******local_a0;
  undefined8 *******local_98;
  long local_90;
  mapped_type *local_88;
  _Base_ptr local_80;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_78;
  map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
  *local_70;
  map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  this_00 = &this->m_nodes;
  local_b4 = entry;
  pmVar6 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](this_00,&local_b4);
  local_a8 = this;
  this_01 = CFGReader::instance(&this->super_CFGReader,pmVar6->addr);
  if (this_01->m_entryNode != (CfgNode *)0x0) {
    __assert_fail("cfg->entryNode() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0x44,"void DCFGReader::buildCFG(int)");
  }
  pCVar7 = (CfgNode *)operator_new(0x18);
  CfgNode::CfgNode(pCVar7,CFG_ENTRY);
  CFG::addNode(this_01,pCVar7);
  pmVar6 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](this_00,&local_b4);
  pCVar8 = CFG::nodeByAddr(this_01,pmVar6->addr);
  if (pCVar8 != (CfgNode *)0x0) {
    __assert_fail("cfg->nodeByAddr(m_nodes[entry].addr) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0x49,"void DCFGReader::buildCFG(int)");
  }
  local_68 = this_00;
  pmVar6 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](this_00,&local_b4);
  pCVar8 = CFGReader::nodeWithAddr(this_01,pmVar6->addr);
  CFG::addEdge(this_01,pCVar7,pCVar8,this_01->m_execs);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = 0;
  local_a0 = &local_a0;
  local_98 = &local_a0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var9[1]._M_next = local_b4;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  local_90 = local_90 + 1;
  if ((undefined8 ********)local_a0 != &local_a0) {
    local_70 = &local_a8->m_edges;
    local_80 = &(local_a8->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b0 = &(local_a8->m_visited)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &local_a8->m_visited;
    do {
      pppppppuVar5 = local_a0;
      local_c4 = *(int *)(local_a0 + 2);
      local_90 = local_90 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(pppppppuVar5);
      if (local_c4 < 4) {
        __assert_fail("src_id > 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                      ,0x54,"void DCFGReader::buildCFG(int)");
      }
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0010d7ee:
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&local_c4);
        local_88 = std::
                   map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
                   ::operator[](local_68,&local_c4);
        pCVar7 = CFG::nodeByAddr(this_01,local_88->addr);
        if ((pCVar7 == (CfgNode *)0x0) || (pCVar7->m_type != CFG_PHANTOM)) {
          __assert_fail("src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                        ,0x5c,"void DCFGReader::buildCFG(int)");
        }
        this_02 = (BlockData *)operator_new(0x90);
        CfgNode::BlockData::BlockData(this_02,local_88->addr,local_88->size,false);
        CfgNode::setData(pCVar7,(Data *)this_02);
        local_c0 = pCVar7;
        p_Var10 = (_List_node_base *)
                  std::
                  map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
                  ::operator[](local_70,&local_c4);
        for (p_Var9 = (((_List_base<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_> *)
                       &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            pDVar4 = local_a8, p_Var9 != p_Var10;
            p_Var9 = (((_List_base<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_> *)
                      &p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
          iVar2 = *(int *)&p_Var9[1]._M_next;
          if (iVar2 == 3) goto LAB_0010daa1;
          p_Var15 = (local_a8->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = local_80;
          if (p_Var15 == (_Base_ptr)0x0) {
LAB_0010d8c3:
            p_Var15 = (_Base_ptr)0x0;
          }
          else {
            do {
              if (iVar2 <= (int)p_Var15[1]._M_color) {
                p_Var13 = p_Var15;
              }
              p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < iVar2];
            } while (p_Var15 != (_Base_ptr)0x0);
            if ((p_Var13 == local_80) || (iVar2 < (int)p_Var13[1]._M_color)) goto LAB_0010d8c3;
            p_Var15 = p_Var13[1]._M_parent;
          }
          iVar3 = *(int *)((long)&p_Var9[1]._M_next + 4);
          if (0x17 < iVar3 - 2U) {
switchD_0010d8e7_caseD_3:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                          ,0x95,"void DCFGReader::buildCFG(int)");
          }
          p_Var11 = p_Var9[1]._M_prev;
          switch(iVar3) {
          case 2:
            if (iVar2 != 2) {
              __assert_fail("edge.dst_id == 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                            ,0x86,"void DCFGReader::buildCFG(int)");
            }
            pCVar7 = CFGReader::haltNode(this_01);
            goto LAB_0010da8e;
          default:
            goto switchD_0010d8e7_caseD_3;
          case 5:
            CFGReader::markIndirect(local_c0);
          case 4:
          case 0x13:
            pDVar4 = local_a8;
            pCVar12 = CFGReader::instance(&local_a8->super_CFGReader,(Addr)p_Var15);
            p_Var15 = (pDVar4->m_visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var13 = local_b0;
            p_Var14 = local_b0;
            if (p_Var15 != (_Base_ptr)0x0) {
              do {
                if (local_c4 <= (int)p_Var15[1]._M_color) {
                  p_Var13 = p_Var15;
                }
                p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < local_c4];
              } while (p_Var15 != (_Base_ptr)0x0);
              if ((p_Var13 != local_b0) && (p_Var14 = p_Var13, local_c4 < (int)p_Var13[1]._M_color))
              {
                p_Var14 = local_b0;
              }
            }
            CFGReader::addCall(local_c0,pCVar12,(unsigned_long_long)p_Var11,p_Var14 == local_b0);
            break;
          case 6:
            pCVar7 = CFGReader::exitNode(this_01);
LAB_0010da8e:
            CFG::addEdge(this_01,local_c0,pCVar7,(unsigned_long_long)p_Var11);
            break;
          case 0xd:
            pCVar7 = CFGReader::nodeWithAddr(this_01,(Addr)p_Var15);
            CFG::addEdge(this_01,local_c0,pCVar7,(unsigned_long_long)p_Var11);
            pCVar7 = CFGReader::nodeWithAddr(this_01,(long)local_88->size + local_88->addr);
            p_Var11 = (_List_node_base *)0x0;
LAB_0010d8f4:
            CFG::addEdge(this_01,local_c0,pCVar7,(unsigned_long_long)p_Var11);
            p_Var11 = (_List_node_base *)operator_new(0x18);
            *(undefined4 *)&p_Var11[1]._M_next = *(undefined4 *)&p_Var9[1]._M_next;
            std::__detail::_List_node_base::_M_hook(p_Var11);
            local_90 = local_90 + 1;
            break;
          case 0x10:
            CFGReader::markIndirect(local_c0);
          case 7:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x15:
          case 0x19:
            pCVar7 = CFGReader::nodeWithAddr(this_01,(Addr)p_Var15);
            goto LAB_0010d8f4;
          case 0x16:
            pCVar12 = CFGReader::instance(&local_a8->super_CFGReader,(Addr)p_Var15);
            p_Var15 = (pDVar4->m_visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var13 = local_b0;
            p_Var14 = local_b0;
            if (p_Var15 != (_Base_ptr)0x0) {
              do {
                if (local_c4 <= (int)p_Var15[1]._M_color) {
                  p_Var13 = p_Var15;
                }
                p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < local_c4];
              } while (p_Var15 != (_Base_ptr)0x0);
              if ((p_Var13 != local_b0) && (p_Var14 = p_Var13, local_c4 < (int)p_Var13[1]._M_color))
              {
                p_Var14 = local_b0;
              }
            }
            CFGReader::addSignalHandler
                      (local_c0,0,pCVar12,(unsigned_long_long)p_Var11,p_Var14 == local_b0);
          }
LAB_0010daa1:
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_78,&local_c4);
      }
      else {
        p_Var15 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = &local_60._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var16 = p_Var13;
          p_Var14 = p_Var15;
          _Var1 = p_Var14[1]._M_color;
          p_Var13 = p_Var14;
          if ((int)_Var1 < local_c4) {
            p_Var13 = p_Var16;
          }
          p_Var15 = (&p_Var14->_M_left)[(int)_Var1 < local_c4];
        } while ((&p_Var14->_M_left)[(int)_Var1 < local_c4] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var13 == &local_60._M_impl.super__Rb_tree_header)
        goto LAB_0010d7ee;
        if ((int)_Var1 < local_c4) {
          p_Var14 = p_Var16;
        }
        if (local_c4 < (int)p_Var14[1]._M_color) goto LAB_0010d7ee;
      }
    } while ((undefined8 ********)local_a0 != &local_a0);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void DCFGReader::buildCFG(int entry) {
	CFG* cfg = this->instance(m_nodes[entry].addr);

	// Add special entry node.
	assert(cfg->entryNode() == 0);
	CfgNode* entry_node = new CfgNode(CfgNode::CFG_ENTRY);
	cfg->addNode(entry_node);

	// Add the first node.
	assert(cfg->nodeByAddr(m_nodes[entry].addr) == 0);
	cfg->addEdge(entry_node, CFGReader::nodeWithAddr(cfg, m_nodes[entry].addr),
					cfg->execs());

	std::set<int> visited;
	std::list<int> worklist;
	worklist.push_back(entry);

	while (!worklist.empty()) {
		int src_id = worklist.front();
		worklist.pop_front();
		assert(src_id > 3);

		if (visited.find(src_id) != visited.cend())
			continue;
		visited.insert(src_id);

		DCFGReader::Node& src_bb = m_nodes[src_id];
		CfgNode* src_node = cfg->nodeByAddr(src_bb.addr);
		assert(src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM);
		src_node->setData(new CfgNode::BlockData(src_bb.addr, src_bb.size));

		for (DCFGReader::Edge& edge : m_edges[src_id]) {
			// Ignore unknown node.
			if (edge.dst_id == UNKNOWN_NODE)
				continue;

			std::map<int, Node>::const_iterator it = m_nodes.find(edge.dst_id);
			Addr dst_addr = (it != m_nodes.end() ? (it->second).addr : 0);

			unsigned long long count = edge.count;

			switch (edge.edge_type) {
				case INDIRECT_UNCONDITIONAL_BRANCH_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough.
				case REP_EDGE:
				case CALL_BYPASS_EDGE:
				case SYSTEM_CALL_BYPASS_EDGE:
				case DIRECT_UNCONDITIONAL_BRANCH_EDGE:
				case FALL_THROUGH_EDGE:
				case EXCLUDED_CODE_BYPASS_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					worklist.push_back(edge.dst_id);
					break;
				case DIRECT_CONDITIONAL_BRANCH_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, src_bb.addr + src_bb.size));
					worklist.push_back(edge.dst_id);
					break;
				case INDIRECT_CALL_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough
				case SYSTEM_CALL_EDGE:
				case DIRECT_CALL_EDGE: {
					CFG* called = this->instance(dst_addr);
					CFGReader::addCall(src_node, called, count,
						m_visited.find(src_id) == m_visited.cend());
					} break;
				case EXIT_EDGE:
					// The destination must be the special exit node (2).
					assert(edge.dst_id == 2);
					cfg->addEdge(src_node, CFGReader::haltNode(cfg), count);
					break;
				case RETURN_EDGE:
					cfg->addEdge(src_node, CFGReader::exitNode(cfg), count);
					break;
				case CONTEXT_CHANGE_EDGE: {
					CFG* sigHandler = this->instance(dst_addr);
					CFGReader::addSignalHandler(src_node, 0, sigHandler, count,
						m_visited.find(src_id) == m_visited.cend());

					} break;
				default: {
					// std::vector<std::string> edgeTypes = readStrings(obj, "EDGE_TYPES");
					// std::cout << "edge type: " << edgeTypes[edge.edge_type] << "\n";
					assert(false);
					} break;
			}
		}

		// Added to the global visited ids.
		m_visited.insert(src_id);
	}
}